

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp.c
# Opt level: O0

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,float amp,
                        float ampoffset)

{
  int iVar1;
  float fVar2;
  double dVar3;
  float fVar4;
  float local_4c;
  float w;
  float q;
  float p;
  int k;
  int j;
  float wdel;
  int i;
  float ampoffset_local;
  float amp_local;
  int m_local;
  float *lsp_local;
  int ln_local;
  int n_local;
  int *map_local;
  float *curve_local;
  
  for (j = 0; j < m; j = j + 1) {
    dVar3 = cos((double)lsp[j]);
    lsp[j] = (float)(dVar3 * 2.0);
  }
  j = 0;
  while (j < n) {
    iVar1 = map[j];
    w = 0.5;
    local_4c = 0.5;
    dVar3 = cos((double)((3.1415927 / (float)ln) * (float)iVar1));
    fVar2 = (float)(dVar3 * 2.0);
    for (p = 1.4013e-45; (int)p < m; p = (float)((int)p + 2)) {
      local_4c = (fVar2 - lsp[(int)p + -1]) * local_4c;
      w = (fVar2 - lsp[(int)p]) * w;
    }
    if (p == (float)m) {
      local_4c = (fVar2 - lsp[(int)p + -1]) * local_4c;
      fVar4 = -fVar2 * fVar2 + 4.0;
      local_4c = local_4c * local_4c;
    }
    else {
      fVar4 = 2.0 - fVar2;
      local_4c = local_4c * (fVar2 + 2.0) * local_4c;
    }
    w = w * fVar4 * w;
    dVar3 = sqrt((double)(w + local_4c));
    dVar3 = exp(((double)amp / dVar3 - (double)ampoffset) * 0.1151292473077774);
    curve[j] = (float)dVar3 * curve[j];
    while (j = j + 1, map[j] == iVar1) {
      curve[j] = (float)dVar3 * curve[j];
    }
  }
  return;
}

Assistant:

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,
                            float amp,float ampoffset){
  int i;
  float wdel=M_PI/ln;
  for(i=0;i<m;i++)lsp[i]=2.f*cos(lsp[i]);

  i=0;
  while(i<n){
    int j,k=map[i];
    float p=.5f;
    float q=.5f;
    float w=2.f*cos(wdel*k);
    for(j=1;j<m;j+=2){
      q *= w-lsp[j-1];
      p *= w-lsp[j];
    }
    if(j==m){
      /* odd order filter; slightly assymetric */
      /* the last coefficient */
      q*=w-lsp[j-1];
      p*=p*(4.f-w*w);
      q*=q;
    }else{
      /* even order filter; still symmetric */
      p*=p*(2.f-w);
      q*=q*(2.f+w);
    }

    q=fromdB(amp/sqrt(p+q)-ampoffset);

    curve[i]*=q;
    while(map[++i]==k)curve[i]*=q;
  }
}